

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O0

void * Intp_ManUnsatCore(Intp_Man_t *p,Sto_Man_t *pCnf,int fLearned,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *p_00;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  abctime aVar11;
  FILE *pFVar12;
  Vec_Int_t *pVVar13;
  abctime aVar14;
  Vec_Str_t *vVisited_00;
  bool bVar15;
  abctime clkTotal;
  Sto_Cls_t *pSStack_38;
  int RetValue;
  Sto_Cls_t *pClause;
  Vec_Str_t *vVisited;
  Vec_Int_t *vCore;
  int fVerbose_local;
  int fLearned_local;
  Sto_Man_t *pCnf_local;
  Intp_Man_t *p_local;
  
  aVar11 = Abc_Clock();
  if ((pCnf->nVars < 1) || (pCnf->nClauses < 1)) {
    __assert_fail("pCnf->nVars > 0 && pCnf->nClauses > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x3cc,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
  }
  p->pCnf = pCnf;
  p->fVerbose = fVerbose;
  Intp_ManResize(p);
  if (p->fProofWrite != 0) {
    pFVar12 = fopen("proof.cnf_","w");
    p->pFile = (FILE *)pFVar12;
    p->Counter = 0;
  }
  Vec_PtrClear(p->vAntClas);
  p->nAntStart = p->pCnf->nRoots;
  pSStack_38 = p->pCnf->pHead;
  while( true ) {
    bVar15 = false;
    if (pSStack_38 != (Sto_Cls_t *)0x0) {
      bVar15 = (*(uint *)&pSStack_38->field_0x1c >> 1 & 1) != 0;
    }
    if (!bVar15) break;
    Intp_ManProofWriteOne(p,pSStack_38);
    pSStack_38 = pSStack_38->pNext;
  }
  iVar7 = Intp_ManProcessRoots(p);
  if (iVar7 != 0) {
    pSStack_38 = p->pCnf->pHead;
    while ((pSStack_38 != (Sto_Cls_t *)0x0 &&
           (((*(uint *)&pSStack_38->field_0x1c >> 1 & 1) != 0 ||
            (iVar7 = Intp_ManProofRecordOne(p,pSStack_38), iVar7 != 0))))) {
      pSStack_38 = pSStack_38->pNext;
    }
  }
  iVar7 = p->pCnf->pEmpty->Id;
  iVar1 = p->nAntStart;
  iVar8 = Vec_PtrSize(p->vAntClas);
  if (iVar7 - iVar1 != iVar8 + -1) {
    __assert_fail("p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x3f7,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
  }
  p_00 = p->vAntClas;
  pVVar13 = Vec_IntAlloc(0);
  Vec_PtrPush(p_00,pVVar13);
  if (p->fProofWrite != 0) {
    fclose((FILE *)p->pFile);
    p->pFile = (FILE *)0x0;
  }
  if (fVerbose != 0) {
    uVar2 = p->pCnf->nVars;
    uVar10 = p->pCnf->nRoots;
    iVar7 = p->pCnf->nClauses;
    iVar1 = p->pCnf->nRoots;
    uVar3 = p->Counter;
    iVar8 = p->Counter;
    iVar4 = p->pCnf->nRoots;
    iVar5 = p->pCnf->nClauses;
    iVar6 = p->pCnf->nRoots;
    iVar9 = Sto_ManMemoryReport(p->pCnf);
    printf("Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n",
           ((double)(iVar8 - iVar4) * 1.0) / (double)(iVar5 - iVar6),
           ((double)iVar9 * 1.0) / 1048576.0,(ulong)uVar2,(ulong)uVar10,(ulong)(uint)(iVar7 - iVar1)
           ,(ulong)uVar3);
    aVar14 = Abc_Clock();
    p->timeTotal = (aVar14 - aVar11) + p->timeTotal;
  }
  pVVar13 = Vec_IntAlloc(1000);
  vVisited_00 = Vec_StrStart(p->pCnf->pEmpty->Id + 1);
  Intp_ManUnsatCore_rec
            (p->vAntClas,p->pCnf->pEmpty->Id,pVVar13,p->pCnf->nRoots,vVisited_00,fLearned);
  Vec_StrFree(vVisited_00);
  if (fVerbose != 0) {
    uVar2 = p->pCnf->nRoots;
    iVar7 = p->pCnf->nClauses;
    iVar1 = p->pCnf->nRoots;
    uVar10 = Vec_IntSize(pVVar13);
    printf("Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n",(ulong)uVar2,
           (ulong)(uint)(iVar7 - iVar1),(ulong)uVar10);
  }
  return pVVar13;
}

Assistant:

void * Intp_ManUnsatCore( Intp_Man_t * p, Sto_Man_t * pCnf, int fLearned, int fVerbose )
{
    Vec_Int_t * vCore;
    Vec_Str_t * vVisited;
    Sto_Cls_t * pClause;
    int RetValue = 1;
    abctime clkTotal = Abc_Clock();

    // check that the CNF makes sense
    assert( pCnf->nVars > 0 && pCnf->nClauses > 0 );
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;

    // adjust the manager
    Intp_ManResize( p ); 

    // construct proof for each clause
    // start the proof
    if ( p->fProofWrite )
    {
        p->pFile = fopen( "proof.cnf_", "w" );
        p->Counter = 0;
    }

    // write the root clauses
//    Vec_IntClear( p->vAnties );
//    Vec_IntFill( p->vBreaks, p->pCnf->nRoots, 0 );
    Vec_PtrClear( p->vAntClas );
    p->nAntStart = p->pCnf->nRoots;

    Sto_ManForEachClauseRoot( p->pCnf, pClause )
        Intp_ManProofWriteOne( p, pClause );

    // propagate root level assignments
    if ( Intp_ManProcessRoots( p ) )
    {
        // if there is no conflict, consider learned clauses
        Sto_ManForEachClause( p->pCnf, pClause )
        {
            if ( pClause->fRoot )
                continue;
            if ( !Intp_ManProofRecordOne( p, pClause ) )
            {
                RetValue = 0;
                break;
            }
        }
    }

    // add the last breaker
//    assert( p->pCnf->pEmpty->Id == Vec_IntSize(p->vBreaks) - 1 );
//    Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
    assert( p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1 );
    Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );

    // stop the proof
    if ( p->fProofWrite )
    {
        fclose( p->pFile );
//        Sat_ProofChecker( "proof.cnf_" );
        p->pFile = NULL;    
    }

    if ( fVerbose )
    {
//        ABC_PRT( "Core", Abc_Clock() - clkTotal );
    printf( "Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n", 
        p->pCnf->nVars, p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, p->Counter,  
        1.0*(p->Counter-p->pCnf->nRoots)/(p->pCnf->nClauses-p->pCnf->nRoots), 
        1.0*Sto_ManMemoryReport(p->pCnf)/(1<<20) );
p->timeTotal += Abc_Clock() - clkTotal;
    }

    // derive the UNSAT core
    vCore = Vec_IntAlloc( 1000 );
    vVisited = Vec_StrStart( p->pCnf->pEmpty->Id+1 );
    Intp_ManUnsatCore_rec( p->vAntClas, p->pCnf->pEmpty->Id, vCore, p->pCnf->nRoots, vVisited, fLearned );
    Vec_StrFree( vVisited );
    if ( fVerbose )
        printf( "Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n", 
            p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, Vec_IntSize(vCore) );
//    Intp_ManUnsatCoreVerify( p->pCnf, vCore );
    return vCore;   
}